

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void codeInteger(Parse *pParse,Expr *pExpr,int negFlag,int iMem)

{
  char cVar1;
  Vdbe *p;
  char *zNum;
  long lVar2;
  int iVar3;
  long in_RAX;
  char *pcVar4;
  long *zP4;
  uint uVar5;
  i64 value;
  long local_28;
  
  p = pParse->pVdbe;
  if ((pExpr->flags & 0x400) != 0) {
    iVar3 = -(pExpr->u).iValue;
    if (negFlag == 0) {
      iVar3 = (pExpr->u).iValue;
    }
    sqlite3VdbeAddOp3(p,7,iVar3,iMem,0);
    return;
  }
  zNum = (pExpr->u).zToken;
  if (zNum == (char *)0x0) {
    uVar5 = 0;
  }
  else {
    uVar5 = 0xffffffff;
    pcVar4 = zNum;
    do {
      uVar5 = uVar5 + 1;
      cVar1 = *pcVar4;
      pcVar4 = pcVar4 + 1;
    } while (cVar1 != '\0');
    uVar5 = uVar5 & 0x3fffffff;
  }
  local_28 = in_RAX;
  iVar3 = sqlite3Atoi64(zNum,&local_28,uVar5,'\x01');
  if ((iVar3 != 0) && ((negFlag == 0 || (iVar3 != 2)))) {
    codeReal(p,zNum,negFlag,iMem);
    return;
  }
  if (negFlag != 0) {
    lVar2 = -local_28;
    local_28 = -0x8000000000000000;
    if (iVar3 != 2) {
      local_28 = lVar2;
    }
  }
  zP4 = (long *)sqlite3DbMallocRaw(p->db,8);
  if (zP4 != (long *)0x0) {
    *zP4 = local_28;
  }
  iVar3 = sqlite3VdbeAddOp3(p,8,0,iMem,0);
  sqlite3VdbeChangeP4(p,iVar3,(char *)zP4,-0xd);
  return;
}

Assistant:

static void codeInteger(Parse *pParse, Expr *pExpr, int negFlag, int iMem){
  Vdbe *v = pParse->pVdbe;
  if( pExpr->flags & EP_IntValue ){
    int i = pExpr->u.iValue;
    assert( i>=0 );
    if( negFlag ) i = -i;
    sqlite3VdbeAddOp2(v, OP_Integer, i, iMem);
  }else{
    int c;
    i64 value;
    const char *z = pExpr->u.zToken;
    assert( z!=0 );
    c = sqlite3Atoi64(z, &value, sqlite3Strlen30(z), SQLITE_UTF8);
    if( c==0 || (c==2 && negFlag) ){
      char *zV;
      if( negFlag ){ value = c==2 ? SMALLEST_INT64 : -value; }
      zV = dup8bytes(v, (char*)&value);
      sqlite3VdbeAddOp4(v, OP_Int64, 0, iMem, 0, zV, P4_INT64);
    }else{
#ifdef SQLITE_OMIT_FLOATING_POINT
      sqlite3ErrorMsg(pParse, "oversized integer: %s%s", negFlag ? "-" : "", z);
#else
      codeReal(v, z, negFlag, iMem);
#endif
    }
  }
}